

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  Layer *pLVar3;
  float *pfVar4;
  size_type sVar5;
  reference ppLVar6;
  undefined8 in_RSI;
  long *in_RDI;
  Mat weights_1 [3];
  Mat weights [4];
  ParamDict pd_4;
  Layer *op;
  Mat bias_data_g;
  Mat weight_data_g;
  int g;
  int num_output_g;
  int channels_g;
  int i;
  int channels;
  int maxk;
  ParamDict pd_3;
  ParamDict pd_2;
  ParamDict pd_1;
  ParamDict pd;
  Layer *in_stack_ffffffffffffcde8;
  int in_stack_ffffffffffffcdf0;
  int in_stack_ffffffffffffcdf4;
  undefined4 in_stack_ffffffffffffcdf8;
  int in_stack_ffffffffffffcdfc;
  ParamDict *in_stack_ffffffffffffce00;
  size_type in_stack_ffffffffffffce08;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_ffffffffffffce10;
  Mat *pMVar7;
  Mat *local_31e8;
  ParamDict *in_stack_ffffffffffffce30;
  Mat *local_31b0;
  Mat *local_3180;
  Mat *local_3148;
  undefined1 local_30e8 [144];
  Mat local_3058 [3];
  Mat local_2f98 [2];
  Mat local_2f08 [4];
  ParamDict local_2e08;
  Layer *local_2508;
  Mat local_24c0 [2];
  int local_2440;
  int local_243c;
  int local_2438;
  int local_2434;
  int local_2430;
  int local_242c;
  undefined1 local_2428 [2304];
  ParamDict local_1b28;
  ParamDict local_1228;
  undefined1 local_918 [2304];
  undefined8 local_18;
  
  local_18 = in_RSI;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 1) {
    pLVar3 = create_layer(in_stack_ffffffffffffcdfc);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce30);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_918);
    ParamDict::~ParamDict(in_stack_ffffffffffffce00);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 2) {
    pLVar3 = create_layer(in_stack_ffffffffffffcdfc);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce30);
    pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100),0);
    ParamDict::set(&local_1228,0,*pfVar4);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_1228);
    ParamDict::~ParamDict(in_stack_ffffffffffffce00);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 3) {
    pLVar3 = create_layer(in_stack_ffffffffffffcdfc);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce30);
    if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x244) & 1) == 0) {
      pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100),0);
      ParamDict::set(&local_1b28,0,*pfVar4);
      pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100),1);
      ParamDict::set(&local_1b28,1,*pfVar4);
    }
    else {
      pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100),0);
      ParamDict::set(&local_1b28,0,
                     *pfVar4 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
      pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100),1);
      ParamDict::set(&local_1b28,1,
                     *pfVar4 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
    }
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_1b28);
    ParamDict::~ParamDict(in_stack_ffffffffffffce00);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) == 4) {
    pLVar3 = create_layer(in_stack_ffffffffffffcdfc);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce30);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_2428);
    ParamDict::~ParamDict(in_stack_ffffffffffffce00);
  }
  if (in_RDI[1] != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_18);
  }
  local_242c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) *
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0);
  uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
  local_2430 = ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                     (long)local_242c) /
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) /
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0))) *
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
  for (local_2434 = 0; iVar2 = local_2434,
      sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2)),
      iVar2 < (int)sVar5; local_2434 = local_2434 + 1) {
    ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                         (long)local_2434);
    if (*ppLVar6 != (value_type)0x0) {
      (*(*ppLVar6)->_vptr_Layer[1])();
    }
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x1b9117);
  if (((local_2430 != *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0)) ||
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) !=
       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8))) ||
     (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) != 3 ||
       ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) != 3 ||
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) != 1)) ||
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) != 1)) ||
        ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) != 1 ||
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) != 1)))))) &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) != 3 ||
       (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) != 3 ||
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4) != 1)) ||
        ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200) != 1 ||
         ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc) != 2 ||
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) != 2)))))))))))) {
    local_2438 = local_2430 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
    local_243c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) /
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (in_stack_ffffffffffffce10,in_stack_ffffffffffffce08);
    for (local_2440 = 0; local_2440 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0);
        local_2440 = local_2440 + 1) {
      Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                 in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0);
      Mat::Mat(local_24c0);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 0) {
        Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                   in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                       (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
        Mat::~Mat((Mat *)0x1b942a);
      }
      local_2508 = create_layer(in_stack_ffffffffffffcdfc);
      ParamDict::ParamDict(in_stack_ffffffffffffce30);
      ParamDict::set(&local_2e08,0,local_243c);
      ParamDict::set(&local_2e08,1,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc));
      ParamDict::set(&local_2e08,0xb,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0));
      ParamDict::set(&local_2e08,2,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc4));
      ParamDict::set(&local_2e08,0xc,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200));
      ParamDict::set(&local_2e08,3,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xcc));
      ParamDict::set(&local_2e08,0xd,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
      ParamDict::set(&local_2e08,4,0);
      ParamDict::set(&local_2e08,0xe,0);
      ParamDict::set(&local_2e08,5,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8));
      ParamDict::set(&local_2e08,6,local_242c * local_2438 * local_243c);
      ParamDict::set(&local_2e08,8,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4));
      ParamDict::set(&local_2e08,9,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8));
      ParamDict::set((ParamDict *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0),
                     (int)((ulong)in_stack_ffffffffffffcde8 >> 0x20),(Mat *)0x1b96cd);
      (*local_2508->_vptr_Layer[2])(local_2508,&local_2e08);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0) {
        local_31b0 = local_3058;
        do {
          Mat::Mat(local_31b0);
          local_31b0 = local_31b0 + 1;
        } while (local_31b0 != local_2f98);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                       (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) != 0) {
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                     in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                         (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
          Mat::~Mat((Mat *)0x1b9b37);
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                     in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                         (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
          Mat::~Mat((Mat *)0x1b9b8d);
        }
        pLVar3 = local_2508;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0),
                   (Mat *)in_stack_ffffffffffffcde8);
        (*pLVar3->_vptr_Layer[3])(pLVar3,local_30e8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x1b9c92);
        pMVar7 = local_3058;
        local_31e8 = local_2f98;
        do {
          local_31e8 = local_31e8 + -1;
          Mat::~Mat((Mat *)0x1b9cbd);
        } while (local_31e8 != pMVar7);
      }
      else {
        local_3148 = local_2f08;
        do {
          Mat::Mat(local_3148);
          local_3148 = local_3148 + 1;
        } while (local_3148 != (Mat *)&local_2e08);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                       (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                       (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) != 0) {
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                     in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                         (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
          Mat::~Mat((Mat *)0x1b980a);
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                     in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffcdfc,in_stack_ffffffffffffcdf8),
                         (Mat *)CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0));
          Mat::~Mat((Mat *)0x1b9860);
        }
        pLVar3 = local_2508;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_ffffffffffffcdf4,in_stack_ffffffffffffcdf0),
                   (Mat *)in_stack_ffffffffffffcde8);
        (*pLVar3->_vptr_Layer[3])(pLVar3,local_2f98);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x1b999c);
        local_3180 = (Mat *)&local_2e08;
        do {
          local_3180 = local_3180 + -1;
          Mat::~Mat((Mat *)0x1b99d3);
        } while (local_3180 != local_2f08);
      }
      (*local_2508->_vptr_Layer[4])(local_2508,local_18);
      in_stack_ffffffffffffcde8 = local_2508;
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                           (long)local_2440);
      *ppLVar6 = in_stack_ffffffffffffcde8;
      ParamDict::~ParamDict(in_stack_ffffffffffffce00);
      Mat::~Mat((Mat *)0x1b9d99);
      Mat::~Mat((Mat *)0x1b9da6);
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        if (use_int8_requantize)
        {
            pd.set(0, activation_params[0] * top_blob_int8_scale);// min
            pd.set(1, activation_params[1] * top_blob_int8_scale);// max
        }
        else
        {
            pd.set(0, activation_params[0]);// min
            pd.set(1, activation_params[1]);// max
        }

        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();      

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        // special path for both int8 and fp32
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            return 0;
        }
    }

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);     

    for (int g=0; g<group; g++)
    {  
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales.range(g, 1);
                weights[3] = bottom_blob_int8_scales.range(g, 1);     
            }

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[3];
            weights[0] = weight_data_g;

            if (int8_scale_term)
            {
                weights[1] = weight_data_int8_scales.range(g, 1);
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

//         op->use_int8_requantize = use_int8_requantize; FIXME

        group_ops[g] = op;
    }      

    return 0;
}